

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze_live_input_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::AnalyzeLiveInputPass::DoLiveInputAnalysis(AnalyzeLiveInputPass *this)

{
  IRContext *this_00;
  ExecutionModel EVar1;
  Status SVar2;
  
  EVar1 = IRContext::GetStage((this->super_Pass).context_);
  SVar2 = Failure;
  if (0xfffffffb < EVar1 - ExecutionModelGLCompute) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisLiveness) == kAnalysisNone) {
      IRContext::BuildLivenessManager(this_00);
    }
    analysis::LivenessManager::GetLiveness
              ((this_00->liveness_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::LivenessManager_*,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::LivenessManager_*,_false>.
               _M_head_impl,this->live_locs_,this->live_builtins_);
    SVar2 = SuccessWithoutChange;
  }
  return SVar2;
}

Assistant:

Pass::Status AnalyzeLiveInputPass::DoLiveInputAnalysis() {
  // Current functionality only supports frag, tesc, tese or geom shaders.
  // Report failure for any other stage.
  auto stage = context()->GetStage();
  if (stage != spv::ExecutionModel::Fragment &&
      stage != spv::ExecutionModel::TessellationControl &&
      stage != spv::ExecutionModel::TessellationEvaluation &&
      stage != spv::ExecutionModel::Geometry)
    return Status::Failure;
  context()->get_liveness_mgr()->GetLiveness(live_locs_, live_builtins_);
  return Status::SuccessWithoutChange;
}